

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2r(char *cval,float *fval,int *status)

{
  int local_ec;
  char local_e8 [4];
  int lval;
  char msg [81];
  char local_88 [8];
  char sval [81];
  char local_29;
  int *piStack_28;
  char dtype;
  int *status_local;
  float *fval_local;
  char *cval_local;
  
  if (*status < 1) {
    if (*cval == '\0') {
      *status = 0xcc;
      cval_local._4_4_ = 0xcc;
    }
    else {
      piStack_28 = status;
      status_local = (int *)fval;
      fval_local = (float *)cval;
      ffdtyp(cval,&local_29,status);
      if ((local_29 == 'I') || (local_29 == 'F')) {
        ffc2rr((char *)fval_local,(float *)status_local,piStack_28);
      }
      else if (local_29 == 'L') {
        ffc2ll((char *)fval_local,&local_ec,piStack_28);
        *status_local = (int)(float)local_ec;
      }
      else if (local_29 == 'C') {
        ffc2s((char *)fval_local,local_88,piStack_28);
        ffc2rr(local_88,(float *)status_local,piStack_28);
      }
      else {
        *piStack_28 = 0x195;
      }
      if (*piStack_28 < 1) {
        cval_local._4_4_ = *piStack_28;
      }
      else {
        *status_local = 0;
        strcpy(local_e8,"Error in ffc2r evaluating string as a float: ");
        strncat(local_e8,(char *)fval_local,0x1e);
        ffpmsg(local_e8);
        cval_local._4_4_ = *piStack_28;
      }
    }
  }
  else {
    cval_local._4_4_ = *status;
  }
  return cval_local._4_4_;
}

Assistant:

int ffc2r(const char *cval,   /* I - string representation of the value */
          float *fval,        /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert formatted string to a real float value, doing implicit
  datatype conversion if necessary
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */

    ffdtyp(cval, &dtype, status);     /* determine the datatype */

    if (dtype == 'I' || dtype == 'F')
        ffc2rr(cval, fval, status);
    else if (dtype == 'L')
    {
        ffc2ll(cval, &lval, status);
        *fval = (float) lval;
    }
    else if (dtype == 'C')
    {
        /* try reading the string as a number */
        ffc2s(cval, sval, status); 
        ffc2rr(sval, fval, status);
    }
    else 
        *status = BAD_FLOATKEY;

    if (*status > 0)
    {
            *fval = 0.;
            strcpy(msg,"Error in ffc2r evaluating string as a float: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }

    return(*status);
}